

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O3

int cuddBddAlignToZdd(DdManager *table)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int *permutation;
  ulong uVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = table->size;
  if ((long)iVar6 == 0) {
    iVar4 = 1;
  }
  else {
    uVar1 = table->sizeZ;
    iVar3 = (int)uVar1 / iVar6;
    iVar4 = 0;
    if (iVar3 * iVar6 == uVar1) {
      permutation = (int *)malloc((long)iVar6 << 2);
      if (permutation == (int *)0x0) {
        table->errorCode = CUDD_MEMORY_OUT;
        iVar4 = 0;
      }
      else {
        if (0 < (int)uVar1) {
          piVar2 = table->invpermZ;
          uVar5 = 0;
          do {
            permutation
            [(int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) /
                  (long)iVar3)] = piVar2[uVar5] / iVar3;
            uVar5 = uVar5 + (long)iVar3;
          } while ((long)uVar5 < (long)(ulong)uVar1);
        }
        cuddGarbageCollect(table,0);
        table->isolated = 0;
        if (0 < (long)table->size) {
          iVar6 = 0;
          lVar7 = 0;
          do {
            if (table->vars[lVar7]->ref == 1) {
              iVar6 = iVar6 + 1;
              table->isolated = iVar6;
            }
            lVar7 = lVar7 + 1;
          } while (table->size != lVar7);
        }
        iVar6 = cuddInitInteract(table);
        iVar4 = 0;
        if (iVar6 != 0) {
          iVar4 = ddShuffle(table,permutation);
          free(permutation);
          if (table->interact != (long *)0x0) {
            free(table->interact);
            table->interact = (long *)0x0;
          }
          bddFixTree(table,table->tree);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int
cuddBddAlignToZdd(
  DdManager * table /* DD manager */)
{
    int *invperm;               /* permutation array */
    int M;                      /* ratio of ZDD variables to BDD variables */
    int i;                      /* loop index */
    int result;                 /* return value */

    /* We assume that a ratio of 0 is OK. */
    if (table->size == 0)
        return(1);

    M = table->sizeZ / table->size;
    /* Check whether the number of ZDD variables is a multiple of the
    ** number of BDD variables.
    */
    if (M * table->size != table->sizeZ)
        return(0);
    /* Create and initialize the inverse permutation array. */
    invperm = ABC_ALLOC(int,table->size);
    if (invperm == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (i = 0; i < table->sizeZ; i += M) {
        int indexZ = table->invpermZ[i];
        int index  = indexZ / M;
        invperm[i / M] = index;
    }
    /* Eliminate dead nodes. Do not scan the cache again, because we
    ** assume that Cudd_zddReduceHeap has already cleared it.
    */
    cuddGarbageCollect(table,0);

    /* Initialize number of isolated projection functions. */
    table->isolated = 0;
    for (i = 0; i < table->size; i++) {
        if (table->vars[i]->ref == 1) table->isolated++;
    }

    /* Initialize the interaction matrix. */
    result = cuddInitInteract(table);
    if (result == 0) return(0);

    result = ddShuffle(table, invperm);
    ABC_FREE(invperm);
    /* Free interaction matrix. */
    ABC_FREE(table->interact);
    /* Fix the BDD variable group tree. */
    bddFixTree(table,table->tree);
    return(result);

}